

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerEncode.h
# Opt level: O3

size_t GetDataSize<SigPolicyQualifierInfo>
                 (vector<SigPolicyQualifierInfo,_std::allocator<SigPolicyQualifierInfo>_> *in)

{
  long lVar1;
  size_t sVar2;
  ulong *puVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  
  lVar1 = *(long *)(in + 8) - *(long *)in;
  if (lVar1 != 0) {
    uVar4 = (lVar1 >> 3) * 0x4ec4ec4ec4ec4ec5;
    puVar3 = (ulong *)(*(long *)in + 8);
    uVar5 = 1;
    sVar2 = 0;
    do {
      uVar6 = *puVar3;
      lVar1 = 2;
      if ((((0x7f < uVar6) && (lVar1 = 3, 0xff < uVar6)) && (lVar1 = 4, 0xffff < uVar6)) &&
         (((lVar1 = 5, 0xffffff < uVar6 && (lVar1 = 6, uVar6 >> 0x20 != 0)) &&
          (lVar1 = 7, uVar6 >> 0x28 != 0)))) {
        lVar1 = (ulong)(uVar6 >> 0x30 == 0) << 3;
      }
      sVar2 = sVar2 + uVar6 + lVar1;
      uVar6 = (ulong)uVar5;
      puVar3 = puVar3 + 0xd;
      uVar5 = uVar5 + 1;
    } while (uVar6 <= uVar4 && uVar4 - uVar6 != 0);
    return sVar2;
  }
  return 0;
}

Assistant:

size_t GetDataSize(std::vector<T>& in) 
{
	size_t ret = 0;
	for (unsigned int i = 0; i < in.size(); ++i)
	{
		ret += in[i].EncodedSize();
	}

	return ret;
}